

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
              *this,int32_t index,encoder_strategy *param_2)

{
  triplet<unsigned_char> *ptVar1;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 aVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  pixel_type *ppVar9;
  triplet<unsigned_char> ra_00;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 aVar10;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aVar11;
  bool bVar12;
  triplet<unsigned_char> tVar13;
  pixel_type *ppVar14;
  pixel_type *ppVar15;
  int iVar16;
  triplet<unsigned_char> local_74;
  triplet<unsigned_char> local_6c;
  triplet<unsigned_char> local_54;
  int local_48;
  int32_t run_length;
  pixel_type ra;
  pixel_type *type_prev_x;
  pixel_type *type_cur_x;
  int32_t count_type_remain;
  encoder_strategy *param_2_local;
  int32_t index_local;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
  *this_local;
  
  iVar16 = this->width_ - index;
  ppVar15 = this->current_line_;
  ppVar9 = this->previous_line_;
  ptVar1 = ppVar15 + (long)index + -1;
  aVar10 = ptVar1->field_0;
  aVar11 = ptVar1->field_1;
  aVar2 = ppVar15[(long)index + -1].field_2;
  ra_00 = *ptVar1;
  tVar13 = *ptVar1;
  local_48 = 0;
  do {
    uVar3 = ppVar15[(long)index + (long)local_48].field_0;
    uVar6 = ppVar15[(long)index + (long)local_48].field_1;
    local_54.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar6;
    local_54.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar3;
    local_54.field_2.v3 = ppVar15[(long)index + (long)local_48].field_2.v3;
    bVar12 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::is_near
                       (&this->traits_,local_54,tVar13);
    if (!bVar12) break;
    ppVar14 = ppVar15 + (long)index + (long)local_48;
    ppVar14->field_0 = aVar10;
    ppVar14->field_1 = aVar11;
    ppVar14->field_2 = aVar2;
    local_48 = local_48 + 1;
  } while (local_48 != iVar16);
  encode_run_pixels(this,local_48,local_48 == iVar16);
  if (local_48 == iVar16) {
    this_local._4_4_ = local_48;
  }
  else {
    uVar4 = ppVar15[(long)index + (long)local_48].field_0;
    uVar7 = ppVar15[(long)index + (long)local_48].field_1;
    local_6c.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar7;
    local_6c.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar4;
    ppVar14 = ppVar9 + (long)index + (long)local_48;
    uVar5 = ppVar14->field_0;
    uVar8 = ppVar14->field_1;
    local_74.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar8;
    local_74.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar5;
    local_6c.field_2.v3 = ppVar15[(long)index + (long)local_48].field_2.v3;
    local_74.field_2.v3 = ppVar9[(long)index + (long)local_48].field_2.v3;
    tVar13 = encode_run_interruption_pixel(this,local_6c,ra_00,local_74);
    ppVar15 = ppVar15 + (long)index + (long)local_48;
    ppVar15->field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)(char)tVar13._0_2_;
    ppVar15->field_1 =
         (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)(char)((ushort)tVar13._0_2_ >> 8);
    (ppVar15->field_2).v3 = (uchar)tVar13.field_2;
    decrement_run_index(this);
    this_local._4_4_ = local_48 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }